

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

int __thiscall
r_code::list<core::P<r_exec::_GMonitor>_>::remove
          (list<core::P<r_exec::_GMonitor>_> *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  P<r_exec::_GMonitor> *this_00;
  _GMonitor *c;
  const_iterator cVar2;
  undefined1 local_28 [8];
  const_iterator i;
  P<r_exec::_GMonitor> *t_local;
  list<core::P<r_exec::_GMonitor>_> *this_local;
  
  i._list = (list<core::P<r_exec::_GMonitor>_> *)__filename;
  const_iterator::const_iterator((const_iterator *)local_28,this,this->used_cells_head);
  while( true ) {
    bVar1 = _iterator::operator!=
                      ((_iterator *)local_28,
                       (_iterator *)list<core::P<r_exec::_GMonitor>>::end_iterator);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    this_00 = const_iterator::operator*((const_iterator *)local_28);
    c = core::P::operator_cast_to__GMonitor_((P *)i._list);
    bVar1 = core::P<r_exec::_GMonitor>::operator==(this_00,c);
    if (bVar1) break;
    const_iterator::operator++((const_iterator *)local_28);
  }
  cVar2 = erase(this,(const_iterator *)local_28);
  return (int)cVar2.super__iterator._cell;
}

Assistant:

void remove(const T &t)
    {
        const_iterator i(this, used_cells_head);

        for (; i != end_iterator; ++i) {
            if ((*i) == t) {
                erase(i);
                return;
            }
        }
    }